

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O3

pair<sjtu::userType_*,_long> __thiscall
sjtu::FileManager<sjtu::userType>::newspace(FileManager<sjtu::userType> *this)

{
  undefined1 *puVar1;
  pair<sjtu::userType_*,_long> pVar2;
  locType offset;
  userType tmp;
  long local_b0;
  undefined1 local_a8 [112];
  undefined8 local_38;
  undefined4 local_28;
  
  puVar1 = &(this->super_FileManager_Base<sjtu::userType>).field_0x18;
  std::ostream::seekp((long)puVar1,_S_beg);
  std::ios::clear((int)this + 8 +
                  (int)*(undefined8 *)
                        (*(long *)&(this->super_FileManager_Base<sjtu::userType>).file + -0x18));
  local_38 = 0xffffffffffffffff;
  local_28 = 0;
  local_b0 = std::ostream::tellp();
  std::ostream::write(puVar1,(long)local_a8);
  pVar2.first = LRUCache<sjtu::userType>::load
                          ((this->super_FileManager_Base<sjtu::userType>).cache,&local_b0);
  pVar2.second = local_b0;
  return pVar2;
}

Assistant:

virtual std::pair<T * , locType> newspace() override
		{
			file.seekp(0 , std::ios_base::end) , file.clear();
			T tmp;locType offset = file.tellp();
			file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
			return std::make_pair(cache -> load(offset) , offset);
		}